

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_fast.cpp
# Opt level: O0

size_t duckdb_zstd::ZSTD_compressBlock_fast_dictMatchState
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  long in_RDI;
  U32 mls;
  size_t in_stack_00000060;
  void *in_stack_00000068;
  U32 *in_stack_00000070;
  seqStore_t *in_stack_00000078;
  ZSTD_matchState_t *in_stack_00000080;
  size_t local_8;
  
  switch(*(undefined4 *)(in_RDI + 0x110)) {
  default:
    local_8 = ZSTD_compressBlock_fast_dictMatchState_4_0
                        (in_stack_00000080,in_stack_00000078,in_stack_00000070,in_stack_00000068,
                         in_stack_00000060);
    break;
  case 5:
    local_8 = ZSTD_compressBlock_fast_dictMatchState_5_0
                        (in_stack_00000080,in_stack_00000078,in_stack_00000070,in_stack_00000068,
                         in_stack_00000060);
    break;
  case 6:
    local_8 = ZSTD_compressBlock_fast_dictMatchState_6_0
                        (in_stack_00000080,in_stack_00000078,in_stack_00000070,in_stack_00000068,
                         in_stack_00000060);
    break;
  case 7:
    local_8 = ZSTD_compressBlock_fast_dictMatchState_7_0
                        (in_stack_00000080,in_stack_00000078,in_stack_00000070,in_stack_00000068,
                         in_stack_00000060);
  }
  return local_8;
}

Assistant:

size_t ZSTD_compressBlock_fast_dictMatchState(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    U32 const mls = ms->cParams.minMatch;
    assert(ms->dictMatchState != NULL);
    switch(mls)
    {
    default: /* includes case 3 */
    case 4 :
        return ZSTD_compressBlock_fast_dictMatchState_4_0(ms, seqStore, rep, src, srcSize);
    case 5 :
        return ZSTD_compressBlock_fast_dictMatchState_5_0(ms, seqStore, rep, src, srcSize);
    case 6 :
        return ZSTD_compressBlock_fast_dictMatchState_6_0(ms, seqStore, rep, src, srcSize);
    case 7 :
        return ZSTD_compressBlock_fast_dictMatchState_7_0(ms, seqStore, rep, src, srcSize);
    }
}